

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itrans_avx2.c
# Opt level: O1

void itrans_dct2_h16_w8_avx2(s16 *src,s16 *dst,int bit_depth)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  int iVar8;
  long lVar9;
  uint uVar10;
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [16];
  s16 tmp [128];
  s16 local_120 [16];
  undefined1 auStack_100 [32];
  undefined1 auStack_e0 [32];
  undefined1 auStack_c0 [32];
  undefined1 auStack_a0 [32];
  undefined1 auStack_80 [32];
  undefined1 auStack_60 [32];
  undefined1 auStack_40 [40];
  
  dct2_butterfly_h16_avx2(src,8,local_120,8,5,0xf);
  uVar10 = 0x14 - bit_depth;
  iVar8 = 1 << (0x13U - (char)bit_depth & 0x1f);
  auVar11._4_4_ = iVar8;
  auVar11._0_4_ = iVar8;
  auVar11._8_4_ = iVar8;
  auVar11._12_4_ = iVar8;
  auVar11._16_4_ = iVar8;
  auVar11._20_4_ = iVar8;
  auVar11._24_4_ = iVar8;
  auVar11._28_4_ = iVar8;
  lVar9 = 0;
  auVar18._8_4_ = 0xffd40026;
  auVar18._0_8_ = 0xffd40026ffd40026;
  auVar18._12_4_ = 0xffd40026;
  auVar18._16_4_ = 0xffd40026;
  auVar18._20_4_ = 0xffd40026;
  auVar18._24_4_ = 0xffd40026;
  auVar18._28_4_ = 0xffd40026;
  auVar19._8_2_ = 0x20;
  auVar19._0_8_ = 0x20002000200020;
  auVar19._10_2_ = 0x20;
  auVar19._12_2_ = 0x20;
  auVar19._14_2_ = 0x20;
  auVar19._16_2_ = 0x20;
  auVar19._18_2_ = 0x20;
  auVar19._20_2_ = 0x20;
  auVar19._22_2_ = 0x20;
  auVar19._24_2_ = 0x20;
  auVar19._26_2_ = 0x20;
  auVar19._28_2_ = 0x20;
  auVar19._30_2_ = 0x20;
  auVar20._8_4_ = 0xffe00020;
  auVar20._0_8_ = 0xffe00020ffe00020;
  auVar20._12_4_ = 0xffe00020;
  auVar20._16_4_ = 0xffe00020;
  auVar20._20_4_ = 0xffe00020;
  auVar20._24_4_ = 0xffe00020;
  auVar20._28_4_ = 0xffe00020;
  auVar21._8_4_ = 0x11002a;
  auVar21._0_8_ = 0x11002a0011002a;
  auVar21._12_4_ = 0x11002a;
  auVar21._16_4_ = 0x11002a;
  auVar21._20_4_ = 0x11002a;
  auVar21._24_4_ = 0x11002a;
  auVar21._28_4_ = 0x11002a;
  auVar22._8_4_ = 0xffd60011;
  auVar22._0_8_ = 0xffd60011ffd60011;
  auVar22._12_4_ = 0xffd60011;
  auVar22._16_4_ = 0xffd60011;
  auVar22._20_4_ = 0xffd60011;
  auVar22._24_4_ = 0xffd60011;
  auVar22._28_4_ = 0xffd60011;
  do {
    auVar2 = vpunpcklwd_avx(*(undefined1 (*) [16])(auStack_100 + lVar9),
                            *(undefined1 (*) [16])(auStack_c0 + lVar9));
    auVar23 = vpunpckhwd_avx(*(undefined1 (*) [16])(auStack_100 + lVar9),
                             *(undefined1 (*) [16])(auStack_c0 + lVar9));
    auVar3 = vpunpcklwd_avx(*(undefined1 (*) [16])(auStack_80 + lVar9),
                            *(undefined1 (*) [16])(auStack_40 + lVar9));
    auVar1 = vpunpckhwd_avx(*(undefined1 (*) [16])(auStack_80 + lVar9),
                            *(undefined1 (*) [16])(auStack_40 + lVar9));
    auVar16._0_16_ = ZEXT116(0) * auVar23 + ZEXT116(1) * auVar2;
    auVar16._16_16_ = ZEXT116(1) * auVar23;
    auVar4 = vpmaddwd_avx2(auVar16,_DAT_0017f620);
    auVar14._0_16_ = ZEXT116(0) * auVar1 + ZEXT116(1) * auVar3;
    auVar14._16_16_ = ZEXT116(1) * auVar1;
    auVar5 = vpmaddwd_avx2(auVar14,_DAT_0017f640);
    auVar4 = vpaddd_avx2(auVar5,auVar4);
    auVar5 = vpmaddwd_avx2(auVar16,_DAT_0017f660);
    auVar15 = vpmaddwd_avx2(auVar14,_DAT_0017f680);
    auVar5 = vpaddd_avx2(auVar15,auVar5);
    auVar15 = vpmaddwd_avx2(auVar16,_DAT_0017f6a0);
    auVar6 = vpmaddwd_avx2(auVar14,_DAT_0017f6c0);
    auVar15 = vpaddd_avx2(auVar6,auVar15);
    auVar6 = vpmaddwd_avx2(auVar16,_DAT_0017f6e0);
    auVar14 = vpmaddwd_avx2(auVar18,auVar14);
    auVar6 = vpaddd_avx2(auVar14,auVar6);
    auVar2 = vpunpcklwd_avx(*(undefined1 (*) [16])((long)local_120 + lVar9),
                            *(undefined1 (*) [16])(auStack_a0 + lVar9));
    auVar23 = vpunpckhwd_avx(*(undefined1 (*) [16])((long)local_120 + lVar9),
                             *(undefined1 (*) [16])(auStack_a0 + lVar9));
    auVar3 = vpunpcklwd_avx(*(undefined1 (*) [16])(auStack_e0 + lVar9),
                            *(undefined1 (*) [16])(auStack_60 + lVar9));
    auVar1 = vpunpckhwd_avx(*(undefined1 (*) [16])(auStack_e0 + lVar9),
                            *(undefined1 (*) [16])(auStack_60 + lVar9));
    auVar12._0_16_ = ZEXT116(0) * auVar23 + ZEXT116(1) * auVar2;
    auVar12._16_16_ = ZEXT116(1) * auVar23;
    auVar14 = vpmaddwd_avx2(auVar19,auVar12);
    auVar16 = vpmaddwd_avx2(auVar20,auVar12);
    auVar13._0_16_ = ZEXT116(0) * auVar1 + ZEXT116(1) * auVar3;
    auVar13._16_16_ = ZEXT116(1) * auVar1;
    auVar12 = vpmaddwd_avx2(auVar21,auVar13);
    auVar13 = vpmaddwd_avx2(auVar22,auVar13);
    auVar17 = vpsubd_avx2(auVar14,auVar12);
    auVar14 = vpaddd_avx2(auVar14,auVar11);
    auVar14 = vpaddd_avx2(auVar14,auVar12);
    auVar7 = vpsubd_avx2(auVar16,auVar13);
    auVar12 = vpaddd_avx2(auVar17,auVar11);
    auVar16 = vpaddd_avx2(auVar16,auVar11);
    auVar16 = vpaddd_avx2(auVar16,auVar13);
    auVar13 = vpaddd_avx2(auVar7,auVar11);
    auVar17 = vpaddd_avx2(auVar4,auVar14);
    auVar14 = vpsubd_avx2(auVar14,auVar4);
    auVar4 = vpaddd_avx2(auVar5,auVar16);
    auVar16 = vpsubd_avx2(auVar16,auVar5);
    auVar5 = vpaddd_avx2(auVar13,auVar15);
    auVar13 = vpsubd_avx2(auVar13,auVar15);
    auVar15 = vpaddd_avx2(auVar12,auVar6);
    auVar12 = vpsubd_avx2(auVar12,auVar6);
    auVar6 = vpsrad_avx2(auVar4,ZEXT416(uVar10));
    auVar4 = vpsrad_avx2(auVar16,ZEXT416(uVar10));
    auVar23 = ZEXT416(uVar10);
    auVar5 = vpsrad_avx2(auVar5,auVar23);
    auVar4 = vpackssdw_avx2(auVar5,auVar4);
    auVar5 = vpsrad_avx2(auVar13,auVar23);
    auVar5 = vpackssdw_avx2(auVar6,auVar5);
    auVar6 = vpsrad_avx2(auVar17,auVar23);
    auVar14 = vpsrad_avx2(auVar14,auVar23);
    auVar15 = vpsrad_avx2(auVar15,ZEXT416(uVar10));
    auVar12 = vpsrad_avx2(auVar12,ZEXT416(uVar10));
    auVar15 = vpackssdw_avx2(auVar15,auVar14);
    auVar6 = vpackssdw_avx2(auVar6,auVar12);
    auVar14 = vpunpcklwd_avx2(auVar6,auVar4);
    auVar4 = vpunpckhwd_avx2(auVar6,auVar4);
    auVar6 = vpunpcklwd_avx2(auVar5,auVar15);
    auVar5 = vpunpckhwd_avx2(auVar5,auVar15);
    auVar12 = vpunpcklwd_avx2(auVar14,auVar6);
    auVar15 = vpunpckhwd_avx2(auVar14,auVar6);
    auVar6 = vpunpcklwd_avx2(auVar4,auVar5);
    auVar4 = vpunpckhwd_avx2(auVar4,auVar5);
    auVar14 = vpunpcklqdq_avx2(auVar12,auVar6);
    auVar5 = vpunpckhqdq_avx2(auVar12,auVar6);
    auVar6 = vpunpcklqdq_avx2(auVar15,auVar4);
    auVar4 = vpunpckhqdq_avx2(auVar15,auVar4);
    auVar15._0_16_ = ZEXT116(0) * auVar5._0_16_ + ZEXT116(1) * auVar14._0_16_;
    auVar15._16_16_ = ZEXT116(0) * auVar14._16_16_ + ZEXT116(1) * auVar5._0_16_;
    auVar5 = vperm2i128_avx2(auVar14,auVar5,0x31);
    auVar17._0_16_ = ZEXT116(0) * auVar4._0_16_ + ZEXT116(1) * auVar6._0_16_;
    auVar17._16_16_ = ZEXT116(0) * auVar6._16_16_ + ZEXT116(1) * auVar4._0_16_;
    auVar4 = vperm2i128_avx2(auVar6,auVar4,0x31);
    *(undefined1 (*) [32])(dst + lVar9 * 4) = auVar15;
    *(undefined1 (*) [32])(dst + lVar9 * 4 + 0x10) = auVar17;
    *(undefined1 (*) [32])(dst + lVar9 * 4 + 0x20) = auVar5;
    *(undefined1 (*) [32])(dst + lVar9 * 4 + 0x30) = auVar4;
    lVar9 = lVar9 + 0x10;
  } while (lVar9 == 0x10);
  return;
}

Assistant:

void itrans_dct2_h16_w8_avx2(s16 *src, s16 *dst, int bit_depth)
{
    ALIGNED_32(s16 tmp[16 * 8]);
    dct2_butterfly_h16_avx2(src, 8, tmp, 8, 5, MAX_TX_DYNAMIC_RANGE);
    dct2_butterfly_h8_avx2(tmp, 16, dst, 16, 20 - bit_depth, bit_depth);
}